

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiRecorder.cpp
# Opt level: O0

bool __thiscall MidiRecorder::writeFile(MidiRecorder *this,QFile *file,char *data,qint64 len)

{
  bool bVar1;
  QMessageLogger local_60;
  QDebug local_40;
  long local_38;
  qint64 writtenLen;
  qint64 len_local;
  char *data_local;
  QFile *file_local;
  MidiRecorder *this_local;
  
  writtenLen = len;
  len_local = (qint64)data;
  data_local = (char *)file;
  file_local = (QFile *)this;
  local_38 = QIODevice::write((char *)file,(longlong)data);
  bVar1 = local_38 != writtenLen;
  if (bVar1) {
    QMessageLogger::QMessageLogger(&local_60,(char *)0x0,0,(char *)0x0);
    QMessageLogger::debug();
    QDebug::operator<<(&local_40,"MidiRecorder: Error writing file");
    QDebug::~QDebug(&local_40);
  }
  this_local._7_1_ = !bVar1;
  return this_local._7_1_;
}

Assistant:

bool MidiRecorder::writeFile(QFile &file, const char *data, qint64 len) {
	qint64 writtenLen = file.write(data, len);
	if (writtenLen == len) return true;
	qDebug() << "MidiRecorder: Error writing file";
	return false;
}